

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFCommon.cpp
# Opt level: O2

bool glTFCommon::Util::ParseDataURI(char *const_uri,size_t uriLen,DataURI *out)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  char cVar7;
  size_t sVar8;
  ulong uVar9;
  
  if (const_uri != (char *)0x0) {
    if ((*const_uri == '\x10') || (iVar3 = strncmp(const_uri,"data:",5), iVar3 == 0)) {
      out->mediaType = "text/plain";
      out->charset = "US-ASCII";
      out->base64 = false;
      if (*const_uri != '\x10') {
        *const_uri = '\x10';
        const_uri[1] = '\0';
        const_uri[2] = '\0';
        const_uri[3] = '\0';
        const_uri[4] = '\0';
        sVar8 = 5;
        cVar7 = const_uri[5];
        uVar9 = sVar8;
        if ((cVar7 != ',') && (cVar7 != ';')) {
          const_uri[1] = '\x05';
          sVar4 = sVar8;
          if (5 < uriLen) {
            sVar4 = uriLen;
          }
          for (; ((uVar9 = sVar8, cVar7 != ',' && (cVar7 != ';')) && (uVar9 = sVar4, sVar8 < uriLen)
                 ); sVar8 = sVar8 + 1) {
            cVar7 = const_uri[sVar8 + 1];
          }
        }
        while ((uVar9 < uriLen && (const_uri[uVar9] == ';'))) {
          const_uri[uVar9] = '\0';
          uVar1 = uVar9 + 1;
          for (uVar5 = uVar1;
              ((uVar6 = uVar5, const_uri[uVar5] != ',' && (const_uri[uVar5] != ';')) &&
              (uVar6 = uriLen, uVar5 < uriLen)); uVar5 = uVar5 + 1) {
          }
          iVar3 = strncmp(const_uri + uVar1,"charset=",8);
          if (iVar3 == 0) {
            const_uri[2] = (char)uVar9 + '\t';
            uVar9 = uVar6;
          }
          else {
            iVar3 = strncmp(const_uri + uVar1,"base64",6);
            uVar9 = uVar6;
            if (iVar3 == 0) {
              const_uri[3] = (char)uVar1;
            }
          }
        }
        if (uVar9 < uriLen) {
          const_uri[uVar9] = '\0';
          cVar7 = (char)uVar9 + '\x01';
        }
        else {
          const_uri[3] = '\0';
          const_uri[1] = '\0';
          const_uri[2] = '\0';
          cVar7 = '\x05';
        }
        const_uri[4] = cVar7;
      }
      if ((long)const_uri[1] != 0) {
        out->mediaType = const_uri + const_uri[1];
      }
      if ((long)const_uri[2] != 0) {
        out->charset = const_uri + const_uri[2];
      }
      if (const_uri[3] != '\0') {
        out->base64 = true;
      }
      cVar7 = const_uri[4];
      out->data = const_uri + cVar7;
      out->dataLength = uriLen - (long)cVar7;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool ParseDataURI(const char* const_uri, size_t uriLen, DataURI& out) {
    if (nullptr == const_uri) {
        return false;
    }

    if (const_uri[0] != 0x10) { // we already parsed this uri?
        if (strncmp(const_uri, "data:", 5) != 0) // not a data uri?
            return false;
    }

    // set defaults
    out.mediaType = "text/plain";
    out.charset = "US-ASCII";
    out.base64 = false;

    char* uri = const_cast<char*>(const_uri);
    if (uri[0] != 0x10) {
        uri[0] = 0x10;
        uri[1] = uri[2] = uri[3] = uri[4] = 0;

        size_t i = 5, j;
        if (uri[i] != ';' && uri[i] != ',') { // has media type?
            uri[1] = char(i);
            for (; uri[i] != ';' && uri[i] != ',' && i < uriLen; ++i) {
                // nothing to do!
            }
        }
        while (uri[i] == ';' && i < uriLen) {
            uri[i++] = '\0';
            for (j = i; uri[i] != ';' && uri[i] != ',' && i < uriLen; ++i) {
                // nothing to do!
            }

            if (strncmp(uri + j, "charset=", 8) == 0) {
                uri[2] = char(j + 8);
            }
            else if (strncmp(uri + j, "base64", 6) == 0) {
                uri[3] = char(j);
            }
        }
        if (i < uriLen) {
            uri[i++] = '\0';
            uri[4] = char(i);
        }
        else {
            uri[1] = uri[2] = uri[3] = 0;
            uri[4] = 5;
        }
    }

    if (uri[1] != 0) {
        out.mediaType = uri + uri[1];
    }
    if (uri[2] != 0) {
        out.charset = uri + uri[2];
    }
    if (uri[3] != 0) {
        out.base64 = true;
    }
    out.data = uri + uri[4];
    out.dataLength = (uri + uriLen) - out.data;

    return true;
}